

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab2.c
# Opt level: O2

int FeedFromArray(void)

{
  int iVar1;
  FILE *__stream;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
    iVar1 = -1;
  }
  else {
    fputs(testInOut[testN].in,__stream);
    fclose(__stream);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int FeedFromArray(void) {
    FILE *const in = fopen("in.txt", "w+");
    if (in == NULL) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(in, "%s", testInOut[testN].in);
    fclose(in);
    return 0;
}